

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O1

Gia_Man_t * Gia_ManEquivReduce2(Gia_Man_t *p)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  void *__s;
  Gia_Rpr_t *pGVar6;
  int *piVar7;
  Gia_Man_t *pGVar8;
  Vec_Int_t *vMap;
  size_t sVar9;
  char *pcVar10;
  Vec_Int_t *pVVar11;
  Gia_Obj_t *pGVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  
  if ((p->pReprs == (Gia_Rpr_t *)0x0) && (p->pSibls != (int *)0x0)) {
    iVar1 = p->nObjs;
    sVar9 = (long)iVar1 * 4;
    __s = malloc(sVar9);
    memset(__s,0xff,sVar9);
    pGVar6 = (Gia_Rpr_t *)calloc((long)iVar1,4);
    p->pReprs = pGVar6;
    uVar14 = (ulong)(uint)p->nObjs;
    if (0 < p->nObjs) {
      lVar16 = 0;
      do {
        p->pReprs[lVar16] = (Gia_Rpr_t)((uint)p->pReprs[lVar16] | 0xfffffff);
        lVar16 = lVar16 + 1;
        uVar14 = (ulong)p->nObjs;
      } while (lVar16 < (long)uVar14);
    }
    if (0 < (int)uVar14) {
      piVar7 = p->pSibls;
      uVar13 = 0;
      do {
        lVar16 = (long)piVar7[uVar13];
        if (0 < lVar16) {
          if (*(int *)((long)__s + lVar16 * 4) == -1) {
            *(int *)((long)__s + lVar16 * 4) = piVar7[uVar13];
          }
          *(undefined4 *)((long)__s + uVar13 * 4) = *(undefined4 *)((long)__s + lVar16 * 4);
        }
        uVar13 = uVar13 + 1;
      } while ((uVar14 & 0xffffffff) != uVar13);
    }
    if (0 < p->nObjs) {
      lVar16 = 0;
      do {
        if (0 < p->pSibls[lVar16]) {
          uVar5 = *(uint *)((long)__s + lVar16 * 4);
          if (lVar16 <= (int)uVar5 && (long)(int)uVar5 != 0xfffffff) {
            __assert_fail("Num == GIA_VOID || Num < Id",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x400,"void Gia_ObjSetRepr(Gia_Man_t *, int, int)");
          }
          p->pReprs[lVar16] = (Gia_Rpr_t)((uint)p->pReprs[lVar16] & 0xf0000000 | uVar5 & 0xfffffff);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 < p->nObjs);
    }
    if (p->pNexts != (int *)0x0) {
      free(p->pNexts);
      p->pNexts = (int *)0x0;
    }
    piVar7 = Gia_ManDeriveNexts(p);
    p->pNexts = piVar7;
    if (__s != (void *)0x0) {
      free(__s);
    }
  }
  if (p->pReprs == (Gia_Rpr_t *)0x0) {
    pGVar8 = (Gia_Man_t *)0x0;
    Abc_Print(1,"Gia_ManEquivReduce(): Equivalence classes are not available.\n");
  }
  else {
    uVar5 = p->nObjs;
    if ((int)uVar5 < 1) {
      uVar14 = 0;
    }
    else {
      uVar13 = 0;
      do {
        uVar14 = uVar13;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        uVar15 = (uint)p->pReprs[uVar13] & 0xfffffff;
        if (uVar15 != 0xfffffff) {
          if ((int)uVar5 <= (int)uVar15) goto LAB_001fe18a;
          if (uVar15 != 0xfffffff) break;
        }
        uVar13 = uVar13 + 1;
        uVar14 = (ulong)uVar5;
      } while (uVar5 != uVar13);
    }
    if ((uint)uVar14 == uVar5) {
      pGVar8 = Gia_ManDup(p);
      return pGVar8;
    }
    vMap = Gia_ManChoiceMinLevel(p);
    Gia_ManSetPhase(p);
    pGVar8 = Gia_ManStart(p->nObjs);
    pcVar2 = p->pName;
    if (pcVar2 == (char *)0x0) {
      pcVar10 = (char *)0x0;
    }
    else {
      sVar9 = strlen(pcVar2);
      pcVar10 = (char *)malloc(sVar9 + 1);
      strcpy(pcVar10,pcVar2);
    }
    pGVar8->pName = pcVar10;
    pcVar2 = p->pSpec;
    if (pcVar2 == (char *)0x0) {
      pcVar10 = (char *)0x0;
    }
    else {
      sVar9 = strlen(pcVar2);
      pcVar10 = (char *)malloc(sVar9 + 1);
      strcpy(pcVar10,pcVar2);
    }
    pGVar8->pSpec = pcVar10;
    Gia_ManFillValue(p);
    p->pObjs->Value = 0;
    pVVar11 = p->vCis;
    if (0 < pVVar11->nSize) {
      lVar16 = 0;
      do {
        iVar1 = pVVar11->pArray[lVar16];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001fe18a;
        pGVar3 = p->pObjs;
        if (pGVar3 == (Gia_Obj_t *)0x0) break;
        pGVar12 = Gia_ManAppendObj(pGVar8);
        uVar14 = *(ulong *)pGVar12;
        *(ulong *)pGVar12 = uVar14 | 0x9fffffff;
        *(ulong *)pGVar12 =
             uVar14 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(pGVar8->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar4 = pGVar8->pObjs;
        if ((pGVar12 < pGVar4) || (pGVar4 + pGVar8->nObjs <= pGVar12)) {
LAB_001fe1a9:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(pGVar8->vCis,(int)((ulong)((long)pGVar12 - (long)pGVar4) >> 2) * -0x55555555);
        pGVar4 = pGVar8->pObjs;
        if ((pGVar12 < pGVar4) || (pGVar4 + pGVar8->nObjs <= pGVar12)) goto LAB_001fe1a9;
        pGVar3[iVar1].Value = (int)((ulong)((long)pGVar12 - (long)pGVar4) >> 2) * 0x55555556;
        lVar16 = lVar16 + 1;
        pVVar11 = p->vCis;
      } while (lVar16 < pVVar11->nSize);
    }
    Gia_ManHashAlloc(pGVar8);
    pVVar11 = p->vCos;
    if (0 < pVVar11->nSize) {
      lVar16 = 0;
      do {
        iVar1 = pVVar11->pArray[lVar16];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001fe18a;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar3 = p->pObjs + iVar1;
        Gia_ManEquivReduce2_rec
                  (pGVar8,p,pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff),vMap,1);
        lVar16 = lVar16 + 1;
        pVVar11 = p->vCos;
      } while (lVar16 < pVVar11->nSize);
    }
    pVVar11 = p->vCos;
    if (0 < pVVar11->nSize) {
      lVar16 = 0;
      do {
        iVar1 = pVVar11->pArray[lVar16];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
LAB_001fe18a:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar3 = p->pObjs + iVar1;
        if ((int)pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].Value < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        uVar5 = Gia_ManAppendCo(pGVar8,(uint)*(undefined8 *)pGVar3 >> 0x1d & 1 ^
                                       pGVar3[-(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff)].
                                       Value);
        pGVar3->Value = uVar5;
        lVar16 = lVar16 + 1;
        pVVar11 = p->vCos;
      } while (lVar16 < pVVar11->nSize);
    }
    Gia_ManHashStop(pGVar8);
    Gia_ManSetRegNum(pGVar8,p->nRegs);
    if (vMap->pArray != (int *)0x0) {
      free(vMap->pArray);
      vMap->pArray = (int *)0x0;
    }
    if (vMap != (Vec_Int_t *)0x0) {
      free(vMap);
    }
  }
  return pGVar8;
}

Assistant:

Gia_Man_t * Gia_ManEquivReduce2( Gia_Man_t * p )
{
    Vec_Int_t * vMap;
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    if ( !p->pReprs && p->pSibls )
    {
        int * pMap = ABC_FALLOC( int, Gia_ManObjNum(p) );
        p->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            Gia_ObjSetRepr( p, i, GIA_VOID );
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            if ( p->pSibls[i] > 0 )
            {
                if ( pMap[p->pSibls[i]] == -1 )
                    pMap[p->pSibls[i]] = p->pSibls[i];
                pMap[i] = pMap[p->pSibls[i]];
            }
        for ( i = 0; i < Gia_ManObjNum(p); i++ )
            if ( p->pSibls[i] > 0 )
                Gia_ObjSetRepr( p, i, pMap[i] );
        //printf( "Created equivalence classes.\n" );
        ABC_FREE( p->pNexts );
        p->pNexts = Gia_ManDeriveNexts( p );
        ABC_FREE( pMap );
    }
    if ( !p->pReprs )
    {
        Abc_Print( 1, "Gia_ManEquivReduce(): Equivalence classes are not available.\n" );
        return NULL;
    }
    // check if there are any equivalences defined
    Gia_ManForEachObj( p, pObj, i )
        if ( Gia_ObjReprObj(p, i) != NULL )
            break;
    if ( i == Gia_ManObjNum(p) )
        return Gia_ManDup( p );
    vMap = Gia_ManChoiceMinLevel( p );
    Gia_ManSetPhase( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManEquivReduce2_rec( pNew, p, Gia_ObjFanin0(pObj), vMap, 1 );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Vec_IntFree( vMap );
    return pNew;
}